

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderIncompleteGSTest::initTestRuns(GeometryShaderIncompleteGSTest *this)

{
  _run local_1f;
  _run local_1c;
  _run local_19;
  _run local_16;
  _run local_13;
  GeometryShaderIncompleteGSTest *local_10;
  GeometryShaderIncompleteGSTest *this_local;
  
  local_10 = this;
  _run::_run(&local_13,false,false,false);
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::push_back(&this->m_test_runs,&local_13);
  _run::_run(&local_16,false,false,true);
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::push_back(&this->m_test_runs,&local_16);
  _run::_run(&local_19,false,true,false);
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::push_back(&this->m_test_runs,&local_19);
  _run::_run(&local_1c,true,true,false);
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::push_back(&this->m_test_runs,&local_1c);
  _run::_run(&local_1f,false,true,true);
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::push_back(&this->m_test_runs,&local_1f);
  return;
}

Assistant:

void GeometryShaderIncompleteGSTest::initTestRuns()
{
	/*                         input_primitive_defined | max_vertices_defined | output_primitive_defined
	 *                         ------------------------|----------------------|-------------------------*/
	m_test_runs.push_back(_run(false, false, false));
	m_test_runs.push_back(_run(false, false, true));
	m_test_runs.push_back(_run(false, true, false));
	m_test_runs.push_back(_run(true, true, false));
	m_test_runs.push_back(_run(false, true, true));
}